

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O2

void __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::reserve(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *this,size_type non_zeros,bool preserve)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  
  uVar1 = non_zeros + (non_zeros == 0);
  if (*(ulong *)this < uVar1) {
    uVar1 = *(ulong *)this;
  }
  *(ulong *)(this + 8) = uVar1;
  if ((int)CONCAT71(in_register_00000011,preserve) == 0) {
    unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),uVar1
              );
    unbounded_array<double,_std::allocator<double>_>::resize
              ((unbounded_array<double,_std::allocator<double>_> *)(this + 0x30),
               *(size_type *)(this + 8));
    uVar1 = 0;
  }
  else {
    unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),uVar1
               ,0);
    unbounded_array<double,_std::allocator<double>_>::resize
              ((unbounded_array<double,_std::allocator<double>_> *)(this + 0x30),
               *(size_type *)(this + 8),0.0);
    uVar1 = *(ulong *)(this + 8);
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 8)) {
      uVar1 = *(ulong *)(this + 0x10);
    }
  }
  *(ulong *)(this + 0x10) = uVar1;
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        void reserve (size_type non_zeros, bool preserve = true) {
            capacity_ = restrict_capacity (non_zeros);
            if (preserve) {
                index_data_. resize (capacity_, size_type ());
                value_data_. resize (capacity_, value_type ());
                filled_ = (std::min) (capacity_, filled_);
            }
            else {
                index_data_. resize (capacity_);
                value_data_. resize (capacity_);
                filled_ = 0;
            }
            storage_invariants ();
        }